

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cpp
# Opt level: O1

void __thiscall
dlib::bsp_context::bsp_context(bsp_context *this,unsigned_long node_id_,map_id_to_con *cons_)

{
  bsp_con *arg1;
  unsigned_long arg2;
  char cVar1;
  tuple<dlib::thread_function_*,_std::default_delete<dlib::thread_function>_> this_00;
  long *plVar2;
  undefined8 *puVar3;
  unsigned_long *puVar4;
  unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_> ptr;
  __uniq_ptr_impl<dlib::thread_function,_std::default_delete<dlib::thread_function>_> local_40;
  undefined **local_38;
  
  this->outstanding_messages = 0;
  this->num_waiting_nodes = 0;
  this->num_terminated_nodes = 0;
  this->current_epoch = 1;
  impl1::thread_safe_message_queue::thread_safe_message_queue(&this->msg_buffer);
  this->_cons = cons_;
  this->_node_id = node_id_;
  local_38 = &PTR__array_0031a718;
  (this->threads).
  super_enumerable<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>_>
  ._vptr_enumerable = (_func_int **)&PTR__array_0031a718;
  (this->threads).pool._vptr_memory_manager_stateless_kernel_1 =
       (_func_int **)&PTR__memory_manager_stateless_kernel_1_0031a798;
  (this->threads).array_size = 0;
  (this->threads).max_array_size = 0;
  (this->threads).array_elements =
       (unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_> *)0x0;
  (this->threads).pos =
       (unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_> *)0x0;
  (this->threads).last_pos =
       (unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_> *)0x0;
  (this->threads)._at_start = true;
  (**(code **)(*(long *)cons_ + 0x18))(cons_);
  while( true ) {
    cVar1 = (**(code **)(*(long *)this->_cons + 0x38))();
    if (cVar1 == '\0') break;
    this_00.
    super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>.
    super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>)
         operator_new(0x88);
    plVar2 = (long *)(**(code **)(*(long *)this->_cons + 0x30))();
    puVar3 = (undefined8 *)(**(code **)(*plVar2 + 0x20))(plVar2);
    arg1 = (bsp_con *)*puVar3;
    arg2 = this->_node_id;
    plVar2 = (long *)(**(code **)(*(long *)this->_cons + 0x30))();
    puVar4 = (unsigned_long *)(**(code **)(*plVar2 + 0x10))(plVar2);
    thread_function::
    thread_function<void(*)(dlib::impl1::bsp_con*,unsigned_long,unsigned_long,dlib::impl1::thread_safe_message_queue&),dlib::impl1::bsp_con*,unsigned_long,unsigned_long,dlib::reference_wrapper<dlib::impl1::thread_safe_message_queue>>
              ((thread_function *)
               this_00.
               super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>
               .super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl,
               impl2::read_thread,arg1,arg2,*puVar4,
               (reference_wrapper<dlib::impl1::thread_safe_message_queue>)&this->msg_buffer);
    local_40._M_t.
    super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>.
    super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl =
         (tuple<dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>)
         (tuple<dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>)
         this_00.
         super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>
         .super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl;
    array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
    ::push_back(&this->threads,
                (unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_> *)
                &local_40);
    if ((_Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>)
        local_40._M_t.
        super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>
        .super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl !=
        (thread_function *)0x0) {
      (**(code **)(*(long *)local_40._M_t.
                            super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>
                            .super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl + 8)
      )();
    }
  }
  return;
}

Assistant:

bsp_context::
    bsp_context(
        unsigned long node_id_,
        impl1::map_id_to_con& cons_
    ) :
        outstanding_messages(0),
        num_waiting_nodes(0),
        num_terminated_nodes(0),
        current_epoch(1),
        _cons(cons_),
        _node_id(node_id_)
    {
        // spawn a bunch of read threads, one for each connection
        _cons.reset();
        while (_cons.move_next())
        {
            std::unique_ptr<thread_function> ptr(new thread_function(&impl2::read_thread,
                                                                _cons.element().value().get(),
                                                                _node_id,
                                                                _cons.element().key(),
                                                                ref(msg_buffer)));
            threads.push_back(ptr);
        }

    }